

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdRetag.cpp
# Opt level: O2

int CmdRetag(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  int *piVar1;
  pointer pIVar2;
  bool bVar3;
  bool bVar4;
  iterator __begin4;
  reference this;
  _Base_ptr p_Var5;
  ostream *poVar6;
  pointer pIVar7;
  string *__return_storage_ptr__;
  string *psVar8;
  iterator __end4;
  pointer pIVar9;
  allocator<char> local_221;
  Database *local_220;
  uint local_214;
  Journal *local_210;
  IntervalFilterFirstOf filtering_1;
  vector<Interval,_std::allocator<Interval>_> intervals;
  undefined1 local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1c0 [4];
  Interval *local_1a0;
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  shared_ptr<IntervalFilter> local_138;
  IntervalFilterAllWithIds filtering;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_220 = database;
  local_210 = journal;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filtering,"verbose",(allocator<char> *)&ids);
  bVar3 = Rules::getBoolean(rules,(string *)&filtering,false);
  std::__cxx11::string::~string((string *)&filtering);
  CLI::getIds(&ids,cli);
  CLI::getTags_abi_cxx11_(&tags,cli);
  if (tags._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    psVar8 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (psVar8,"At least one tag must be specified. See \'timew help retag\'.",
               (allocator<char> *)&filtering);
    __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  Journal::startTransaction(local_210);
  flattenDatabase(local_220,rules);
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (ids._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    filtering._id_it._M_node = (_Base_ptr)0x0;
    filtering._id_end._M_node = (_Base_ptr)0x0;
    filtering._ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    filtering._ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    filtering._ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    filtering._ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    filtering._ids._M_t._M_impl._0_8_ = 0;
    filtering._ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    filtering._ids._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    filtering.super_IntervalFilter._vptr_IntervalFilter = (_func_int **)0x0;
    filtering.super_IntervalFilter._done = false;
    filtering.super_IntervalFilter._9_7_ = 0;
    Range::Range((Range *)&filtering);
    std::make_shared<IntervalFilterAllInRange,Range>((Range *)local_1c8);
    local_138.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1c8;
    local_138.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_1c0[0]._M_pi;
    local_1c8 = (undefined1  [8])0x0;
    a_Stack_1c0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    IntervalFilterFirstOf::IntervalFilterFirstOf(&filtering_1,&local_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.super___shared_ptr<IntervalFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1c0);
    getTracked((vector<Interval,_std::allocator<Interval>_> *)&filtering,local_220,rules,
               &filtering_1.super_IntervalFilter);
    if (filtering.super_IntervalFilter._vptr_IntervalFilter ==
        (_func_int **)filtering.super_IntervalFilter._8_8_) {
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (psVar8,"There is no active time tracking.",(allocator<char> *)local_1c8);
      __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    this = std::vector<Interval,_std::allocator<Interval>_>::at
                     ((vector<Interval,_std::allocator<Interval>_> *)&filtering,0);
    bVar4 = Range::is_open(&this->super_Range);
    if (!bVar4) {
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (psVar8,"At least one ID must be specified. See \'timew help retag\'.",
                 (allocator<char> *)local_1c8);
      __cxa_throw(psVar8,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::vector<Interval,_std::allocator<Interval>_>::operator=
              (&intervals,(vector<Interval,_std::allocator<Interval>_> *)&filtering);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)&filtering);
    IntervalFilterFirstOf::~IntervalFilterFirstOf(&filtering_1);
  }
  else {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_60,&ids._M_t);
    IntervalFilterAllWithIds::IntervalFilterAllWithIds
              (&filtering,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    getTracked((vector<Interval,_std::allocator<Interval>_> *)&filtering_1,local_220,rules,
               &filtering.super_IntervalFilter);
    std::vector<Interval,_std::allocator<Interval>_>::_M_move_assign(&intervals,&filtering_1);
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)&filtering_1);
    pIVar2 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pIVar9 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_start) / 0xc0 !=
        ids._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      for (p_Var5 = ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left; pIVar7 = pIVar9,
          (_Rb_tree_header *)p_Var5 != &ids._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        do {
          if (pIVar7 == pIVar2) {
            __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&filtering_1,"ID \'@{1}\' does not correspond to any tracking.",
                       (allocator<char> *)local_1c8);
            format<int>(__return_storage_ptr__,(string *)&filtering_1,p_Var5[1]._M_color);
            __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          piVar1 = &pIVar7->id;
          pIVar7 = pIVar7 + 1;
        } while (*piVar1 != p_Var5[1]._M_color);
      }
    }
    IntervalFilterAllWithIds::~IntervalFilterAllWithIds(&filtering);
  }
  local_1a0 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_214 = (uint)bVar3;
  for (pIVar9 = intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
                super__Vector_impl_data._M_start; pIVar9 != local_1a0; pIVar9 = pIVar9 + 1) {
    Interval::Interval((Interval *)&filtering,pIVar9);
    Interval::clearTags((Interval *)&filtering);
    for (p_Var5 = tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &tags._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      Interval::tag((Interval *)&filtering,(string *)(p_Var5 + 1));
    }
    Database::modifyInterval(local_220,pIVar9,(Interval *)&filtering,SUB41(local_214,0));
    if (bVar3) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Retagged @");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pIVar9->id);
      poVar6 = std::operator<<(poVar6," as ");
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8," ",&local_221);
      joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                ((string *)&filtering_1,(string *)local_1c8,&tags);
      poVar6 = std::operator<<(poVar6,(string *)&filtering_1);
      std::operator<<(poVar6,'\n');
      std::__cxx11::string::~string((string *)&filtering_1);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    Interval::~Interval((Interval *)&filtering);
  }
  Journal::endTransaction(local_210);
  std::vector<Interval,_std::allocator<Interval>_>::~vector(&intervals);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&tags._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&ids._M_t);
  return 0;
}

Assistant:

int CmdRetag (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  // Gather IDs and TAGs.
  std::set <int> ids = cli.getIds ();
  std::set <std::string> tags = cli.getTags ();

  if (tags.empty ())
  {
    throw std::string ("At least one tag must be specified. See 'timew help retag'.");
  }

  journal.startTransaction ();

  flattenDatabase (database, rules);
  std::vector <Interval> intervals;

  if (ids.empty ())
  {
    IntervalFilterFirstOf filtering {std::make_shared <IntervalFilterAllInRange> (Range {})};
    auto latest = getTracked (database, rules, filtering);

    if (latest.empty ())
    {
      throw std::string ("There is no active time tracking.");
    }
    else if (! latest.at (0).is_open ())
    {
      throw std::string ("At least one ID must be specified. See 'timew help retag'.");
    }

    intervals = latest;
  }
  else
  {
    auto filtering = IntervalFilterAllWithIds (ids);
    intervals = getTracked (database, rules, filtering);

    if (intervals.size () != ids.size ())
    {
      for (auto& id: ids)
      {
        bool found = false;

        for (auto& interval: intervals)
        {
          if (interval.id == id)
          {
            found = true;
            break;
          }
        }
        if (! found)
        {
          throw format ("ID '@{1}' does not correspond to any tracking.", id);
        }
      }
    }
  }

  // Remove old tags and apply new tags to intervals.
  for (const auto& interval : intervals)
  {
    Interval modified {interval};

    modified.clearTags ();

    for (auto& tag : tags)
    {
      modified.tag (tag);
    }

    database.modifyInterval (interval, modified, verbose);

    if (verbose)
    {
      std::cout << "Retagged @" << interval.id << " as " << joinQuotedIfNeeded (" ", tags) << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}